

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lls.c
# Opt level: O3

int minfit(double *AB,int M,int N,int P,double *q)

{
  double *pdVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  void *__ptr;
  ulong uVar6;
  double *pdVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  double *pdVar21;
  ulong uVar22;
  int iVar23;
  long lVar24;
  double *pdVar25;
  void *pvVar26;
  double *pdVar27;
  ulong uVar28;
  ulong uVar29;
  double *pdVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double __x;
  double dVar37;
  double dVar38;
  double *local_128;
  double *local_e8;
  ulong local_78;
  
  lVar24 = (long)N;
  __ptr = malloc(lVar24 * 8);
  dVar31 = macheps();
  iVar4 = P + N;
  pdVar1 = AB + 1;
  lVar15 = (long)iVar4;
  uVar28 = (ulong)(uint)N;
  if (N < 1) {
    dVar38 = 0.0;
  }
  else {
    lVar19 = (long)M;
    lVar2 = lVar15 * 8;
    local_e8 = AB + lVar15;
    uVar16 = 1;
    dVar32 = 0.0;
    pdVar7 = pdVar1;
    uVar22 = 0;
    pdVar30 = AB;
    pvVar26 = __ptr;
    uVar29 = uVar28;
    dVar34 = 0.0;
    local_78 = (ulong)(uint)M;
    do {
      *(double *)((long)__ptr + uVar22 * 8) = dVar32;
      dVar38 = 0.0;
      uVar6 = local_78;
      pdVar21 = pdVar30;
      if ((long)uVar22 < lVar19) {
        do {
          dVar38 = dVar38 + *pdVar21 * *pdVar21;
          uVar6 = uVar6 - 1;
          pdVar21 = pdVar21 + lVar15;
        } while (uVar6 != 0);
      }
      uVar6 = uVar22 + 1;
      dVar32 = 0.0;
      if (dVar31 * dVar31 <= dVar38) {
        iVar5 = (iVar4 + 1) * (int)uVar22;
        dVar35 = AB[iVar5];
        if (dVar38 < 0.0) {
          dVar32 = sqrt(dVar38);
        }
        else {
          dVar32 = SQRT(dVar38);
        }
        dVar32 = (double)(~-(ulong)(dVar35 < 0.0) & (ulong)-dVar32 |
                         -(ulong)(dVar35 < 0.0) & (ulong)dVar32);
        AB[iVar5] = dVar35 - dVar32;
        if ((long)uVar6 < lVar15) {
          pdVar21 = pdVar7;
          uVar10 = uVar16;
          do {
            if ((long)uVar22 < lVar19) {
              dVar33 = 0.0;
              lVar17 = 0;
              uVar14 = local_78;
              do {
                dVar33 = dVar33 + *(double *)((long)pdVar30 + lVar17) *
                                  *(double *)((long)pdVar21 + lVar17);
                lVar17 = lVar17 + lVar2;
                uVar14 = uVar14 - 1;
              } while (uVar14 != 0);
              if ((long)uVar22 < lVar19) {
                lVar17 = 0;
                uVar14 = local_78;
                do {
                  *(double *)((long)pdVar21 + lVar17) =
                       *(double *)((long)pdVar30 + lVar17) * (dVar33 / (dVar35 * dVar32 - dVar38)) +
                       *(double *)((long)pdVar21 + lVar17);
                  lVar17 = lVar17 + lVar2;
                  uVar14 = uVar14 - 1;
                } while (uVar14 != 0);
              }
            }
            uVar10 = uVar10 + 1;
            pdVar21 = pdVar21 + 1;
          } while ((long)uVar10 < lVar15);
        }
      }
      dVar38 = 0.0;
      q[uVar22] = dVar32;
      if ((long)uVar6 < lVar24 && (long)uVar22 < lVar19) {
        dVar38 = 0.0;
        uVar10 = 1;
        do {
          dVar38 = dVar38 + pdVar30[uVar10] * pdVar30[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar29 != uVar10);
      }
      dVar32 = 0.0;
      if (dVar31 * dVar31 <= dVar38) {
        dVar35 = pdVar1[uVar22 * lVar15 + uVar22];
        if (dVar38 < 0.0) {
          dVar32 = sqrt(dVar38);
        }
        else {
          dVar32 = SQRT(dVar38);
        }
        dVar32 = (double)(~-(ulong)(dVar35 < 0.0) & (ulong)-dVar32 |
                         -(ulong)(dVar35 < 0.0) & (ulong)dVar32);
        pdVar1[uVar22 * lVar15 + uVar22] = dVar35 - dVar32;
        if ((long)uVar6 < lVar24) {
          uVar10 = 1;
          do {
            *(double *)((long)pvVar26 + uVar10 * 8) = pdVar30[uVar10] / (dVar35 * dVar32 - dVar38);
            uVar10 = uVar10 + 1;
          } while (uVar29 != uVar10);
        }
        pdVar21 = local_e8;
        uVar10 = uVar16;
        if ((long)uVar6 < lVar19) {
          do {
            if ((long)uVar6 < lVar24) {
              dVar38 = 0.0;
              uVar14 = 1;
              do {
                dVar38 = dVar38 + pdVar21[uVar14] * pdVar30[uVar14];
                uVar14 = uVar14 + 1;
              } while (uVar29 != uVar14);
              if ((long)uVar6 < lVar24) {
                uVar14 = 1;
                do {
                  pdVar21[uVar14] =
                       *(double *)((long)pvVar26 + uVar14 * 8) * dVar38 + pdVar21[uVar14];
                  uVar14 = uVar14 + 1;
                } while (uVar29 != uVar14);
              }
            }
            uVar10 = uVar10 + 1;
            pdVar21 = pdVar21 + lVar15;
          } while (uVar10 != (uint)M);
        }
      }
      dVar38 = ABS(*(double *)((long)__ptr + uVar22 * 8)) + ABS(q[uVar22]);
      if (dVar38 <= dVar34) {
        dVar38 = dVar34;
      }
      uVar16 = uVar16 + 1;
      pdVar30 = pdVar30 + lVar15 + 1;
      local_78 = local_78 - 1;
      pdVar7 = pdVar7 + lVar15 + 1;
      uVar29 = uVar29 - 1;
      pvVar26 = (void *)((long)pvVar26 + 8);
      local_e8 = local_e8 + lVar15 + 1;
      uVar22 = uVar6;
      dVar34 = dVar38;
    } while (uVar6 != uVar28);
    if (0 < N) {
      pdVar7 = AB + (lVar24 + -1) * lVar15;
      pdVar30 = AB + lVar24;
      lVar19 = lVar24;
      do {
        pdVar30 = pdVar30 + -1;
        iVar5 = (int)lVar19;
        lVar20 = (long)iVar5;
        lVar17 = lVar19 + -1;
        lVar11 = (long)(iVar4 * (int)lVar17);
        if (((dVar32 != 0.0) || (NAN(dVar32))) && (iVar5 < N)) {
          pdVar21 = (double *)((long)pdVar30 + lVar2 * lVar20);
          pdVar27 = (double *)((lVar15 * 8 + 8) * lVar20 + (long)AB);
          dVar34 = AB[lVar19 + lVar11];
          lVar12 = (long)iVar5;
          pdVar25 = pdVar21;
          do {
            *pdVar25 = pdVar7[lVar12] / (dVar32 * dVar34);
            lVar12 = lVar12 + 1;
            pdVar25 = pdVar25 + lVar15;
          } while (lVar24 != lVar12);
          if (iVar5 < N) {
            lVar12 = (long)iVar5;
            do {
              dVar32 = 0.0;
              lVar13 = (long)iVar5;
              pdVar25 = pdVar27;
              do {
                dVar32 = dVar32 + pdVar7[lVar13] * *pdVar25;
                lVar13 = lVar13 + 1;
                pdVar25 = pdVar25 + lVar15;
              } while (lVar24 != lVar13);
              lVar18 = 0;
              lVar13 = lVar24 - lVar20;
              do {
                *(double *)((long)pdVar27 + lVar18) =
                     *(double *)((long)pdVar21 + lVar18) * dVar32 +
                     *(double *)((long)pdVar27 + lVar18);
                lVar18 = lVar18 + lVar2;
                lVar13 = lVar13 + -1;
              } while (lVar13 != 0);
              lVar12 = lVar12 + 1;
              pdVar27 = pdVar27 + 1;
            } while (lVar12 != lVar24);
          }
        }
        if (iVar5 < N) {
          pdVar21 = (double *)(lVar2 * lVar20 + (long)pdVar30);
          do {
            *pdVar21 = 0.0;
            pdVar7[lVar20] = 0.0;
            lVar20 = lVar20 + 1;
            pdVar21 = pdVar21 + lVar15;
          } while (lVar24 != lVar20);
        }
        AB[lVar17 + lVar11] = 1.0;
        dVar32 = *(double *)((long)__ptr + lVar17 * 8);
        pdVar7 = pdVar7 + -lVar15;
        bVar3 = 1 < lVar19;
        lVar19 = lVar17;
      } while (bVar3);
    }
  }
  iVar5 = N - M;
  if (iVar5 != 0 && M <= N) {
    iVar8 = N + 1;
    if (N + 1 < iVar4) {
      iVar8 = iVar4;
    }
    iVar23 = M * iVar4 + N;
    do {
      if (0 < P) {
        memset(AB + iVar23,0,(ulong)(uint)(~N + iVar8) * 8 + 8);
      }
      iVar23 = iVar23 + iVar4;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  if (N < 1) {
LAB_0012616e:
    free(__ptr);
    return 0;
  }
  dVar31 = dVar31 * dVar38;
  pvVar26 = (void *)((long)__ptr + (ulong)(N - 1) * 8);
  pdVar7 = q + (N - 1);
  lVar2 = lVar15 * 8;
  local_128 = AB + lVar24;
  uVar22 = lVar24 - 1;
LAB_00125b43:
  local_128 = local_128 + -1;
  pdVar7 = pdVar7 + -1;
  uVar29 = uVar22 - 1;
  iVar5 = 1;
  do {
    lVar19 = 0;
    iVar8 = N;
    do {
      if (ABS(*(double *)((long)pvVar26 + lVar19)) <= dVar31) {
        uVar9 = iVar8 - 1;
        goto LAB_00125cf7;
      }
      if (ABS(*(double *)((long)pdVar7 + lVar19)) <= dVar31) break;
      iVar8 = iVar8 + -1;
      lVar19 = lVar19 + -8;
    } while (0 < iVar8);
    uVar9 = iVar8 - 1;
    lVar19 = (long)(int)uVar9;
    if (lVar19 <= (long)uVar22) {
      iVar8 = (iVar8 + -2) * iVar4;
      pdVar30 = (double *)(lVar2 * lVar19 + (long)AB);
      dVar38 = 0.0;
      dVar32 = 1.0;
      do {
        dVar34 = *(double *)((long)__ptr + lVar19 * 8);
        dVar32 = dVar32 * dVar34;
        *(double *)((long)__ptr + lVar19 * 8) = dVar38 * dVar34;
        if (ABS(dVar32) <= dVar31) break;
        dVar38 = q[lVar19];
        dVar34 = hypot(dVar32,dVar38);
        q[lVar19] = dVar34;
        dVar38 = dVar38 / dVar34;
        dVar32 = -dVar32 / dVar34;
        lVar17 = lVar24;
        if (0 < P) {
          do {
            dVar34 = AB[iVar8 + lVar17];
            dVar35 = pdVar30[lVar17];
            AB[iVar8 + lVar17] = dVar34 * dVar38 + dVar32 * dVar35;
            pdVar30[lVar17] = dVar35 * dVar38 - dVar32 * dVar34;
            lVar17 = lVar17 + 1;
          } while (lVar17 < lVar15);
        }
        pdVar30 = pdVar30 + lVar15;
        bVar3 = lVar19 < (long)uVar22;
        lVar19 = lVar19 + 1;
      } while (bVar3);
    }
LAB_00125cf7:
    dVar38 = q[uVar22];
    if (uVar22 == uVar9) break;
    lVar19 = (long)(int)uVar9;
    dVar32 = q[lVar19];
    dVar34 = q[uVar29];
    dVar35 = *(double *)((long)__ptr + uVar29 * 8);
    dVar33 = *(double *)((long)__ptr + uVar22 * 8);
    dVar35 = ((dVar34 / dVar33 + ((dVar35 - dVar38) / dVar34) * ((dVar38 + dVar35) / dVar33)) -
             dVar33 / dVar34) * 0.5;
    dVar36 = hypot(dVar35,1.0);
    dVar38 = (dVar33 / dVar32) *
             (dVar34 / ((double)((ulong)-dVar36 & -(ulong)(dVar35 < 0.0) |
                                ~-(ulong)(dVar35 < 0.0) & (ulong)dVar36) + dVar35) - dVar33) +
             (dVar32 - (dVar38 / dVar32) * dVar38);
    if (lVar19 < (long)uVar22) {
      pdVar30 = pdVar1 + lVar19;
      lVar11 = lVar19 << 0x20;
      pdVar25 = (double *)((lVar19 + 1) * lVar2 + (long)AB);
      pdVar21 = (double *)(lVar2 * lVar19 + (long)AB);
      dVar35 = 1.0;
      dVar34 = 1.0;
      lVar17 = lVar19;
      do {
        lVar20 = lVar17 + 1;
        dVar33 = *(double *)((long)__ptr + lVar17 * 8 + 8);
        dVar36 = q[lVar17 + 1];
        dVar35 = dVar35 * dVar33;
        dVar34 = dVar34 * dVar33;
        dVar33 = hypot(dVar38,dVar35);
        *(double *)((long)__ptr + lVar17 * 8) = dVar33;
        dVar38 = dVar38 / dVar33;
        dVar33 = dVar35 / dVar33;
        __x = dVar32 * dVar38 + dVar34 * dVar33;
        dVar32 = dVar34 * dVar38 - dVar33 * dVar32;
        dVar35 = dVar36 * dVar33;
        dVar36 = dVar36 * dVar38;
        uVar16 = uVar28;
        lVar12 = lVar11;
        pdVar27 = pdVar30;
        do {
          dVar34 = *(double *)((long)AB + (lVar12 >> 0x1d));
          dVar37 = *pdVar27;
          *(double *)((long)AB + (lVar12 >> 0x1d)) = dVar34 * dVar38 + dVar33 * dVar37;
          *pdVar27 = dVar37 * dVar38 - dVar33 * dVar34;
          pdVar27 = pdVar27 + lVar15;
          lVar12 = lVar12 + (lVar15 << 0x20);
          uVar16 = uVar16 - 1;
        } while (uVar16 != 0);
        dVar37 = hypot(__x,dVar35);
        dVar35 = dVar35 / dVar37;
        if ((dVar37 == 0.0) && (!NAN(dVar37))) {
          dVar35 = dVar33;
        }
        dVar34 = __x / dVar37;
        if ((dVar37 == 0.0) && (!NAN(dVar37))) {
          dVar34 = dVar38;
        }
        q[lVar17] = dVar37;
        lVar17 = lVar24;
        if (0 < P) {
          do {
            dVar38 = pdVar21[lVar17];
            dVar33 = pdVar25[lVar17];
            pdVar21[lVar17] = dVar38 * dVar34 + dVar35 * dVar33;
            pdVar25[lVar17] = dVar33 * dVar34 - dVar35 * dVar38;
            lVar17 = lVar17 + 1;
          } while (lVar17 < lVar15);
        }
        dVar38 = dVar34 * dVar32 + dVar36 * dVar35;
        dVar32 = dVar34 * dVar36 - dVar32 * dVar35;
        pdVar30 = pdVar30 + 1;
        lVar11 = lVar11 + 0x100000000;
        pdVar25 = pdVar25 + lVar15;
        pdVar21 = pdVar21 + lVar15;
        lVar17 = lVar20;
      } while (lVar20 < (long)uVar22);
    }
    *(undefined8 *)((long)__ptr + lVar19 * 8) = 0;
    *(double *)((long)__ptr + uVar22 * 8) = dVar38;
    q[uVar22] = dVar32;
    iVar5 = iVar5 + 1;
    if (iVar5 == 0x33) {
      puts("Convergence Not Achieved ");
      return 0xf;
    }
  } while( true );
  if (dVar38 < 0.0) {
    q[uVar22] = -dVar38;
    uVar16 = uVar28;
    pdVar30 = local_128;
    do {
      *pdVar30 = -*pdVar30;
      pdVar30 = pdVar30 + lVar15;
      uVar16 = uVar16 - 1;
    } while (uVar16 != 0);
  }
  N = N + -1;
  pvVar26 = (void *)((long)pvVar26 + -8);
  bVar3 = (long)uVar22 < 1;
  uVar22 = uVar29;
  if (bVar3) goto LAB_0012616e;
  goto LAB_00125b43;
}

Assistant:

int minfit(double *AB,int M,int N,int P,double *q) {
	int i,j,k,l,t,t2,ierr,cancel,iter,l1,np,n1;
	double eps,g,x,s,temp,f,h,tol,c,y,z;
	double *e;
	/*
     THIS SUBROUTINE IS THE MODIFIED C TRANSLATION OF THE
     EISPACK FORTRAN TRANSLATION OF THE ALGOL PROCEDURE MINFIT,
     NUM. MATH. 14, 403-420(1970) BY GOLUB AND REINSCH.
     HANDBOOK FOR AUTO. COMP., VOL II-LINEAR ALGEBRA, 134-151(1971).
	 */
	/*
	 * AB MAX(M,N) X (N+P)
	 * q N X 1
	 *
	 * On Input AB = [A:B]
	 * On Output AB = [V:C] where C = U'*B
	 */

	e = (double*) malloc(sizeof(double) * N);
	ierr = 0;
	eps = macheps();
	tol = eps * eps;
	g = x = 0.0;
	np = N + P;

	for(i = 0; i < N;++i) {
		l = i+1;
		e[i] = g;
		s = 0.0;

		for(k = i; k < M;++k) {
			t = k * np;
			temp = AB[t+i];
			s += temp*temp;
		}
		if (s < tol) {
			g = 0.0;
		} else {
			f = AB[i*np+i];
			g = (f < 0) ? sqrt(s) : -sqrt(s);
			h = f * g - s;
			AB[i*np+i] = f - g;

			for(j = l; j < np;++j) {
				s = 0.0;
				for(k = i; k < M;++k) {
					t = k * np;
					s += (AB[t+i]*AB[t+j]);
				}
				f = s / h;
				for(k = i; k < M;++k) {
					t = k * np;
					AB[t+j] += (f * AB[t+i]);
				}
			}

		}

        q[i] = g;
        s = 0.0;
        t = i * np;
        if (i < M) {
			for(k = l; k < N;++k) {
				temp = AB[t+k];
				s = s + temp*temp;
			}
        }
        if (s < tol) {
        	g = 0.0;
        } else {
        	f = AB[t+i+1];
			g = (f < 0) ? sqrt(s) : -sqrt(s);
			h = f * g - s;
            AB[t+i+1] = f - g;
            for(k = l;k < N;++k) {
              	e[k] = AB[t+k] / h;
            }

            for (j = l; j < M; j++) {
                s = 0.0;
                t2 = j * np;
                for (k = l; k < N; k++) {
                     s += AB[t2+k] * AB[t+k];
                }
                for (k = l; k < N; k++) {
                     AB[t2+k] += s * e[k];
                }
            }

        }

        temp = fabs(q[i]) + fabs(e[i]);

        if (x < temp) {
        	x = temp;
        }
	}

	//Accumulating Right Hand Transformations

	for(i = N - 1;i >= 0;--i) {
		t = i * np;
		if (g != 0.0) {
			h = AB[t+i+1] * g;
			for(j = l;j < N;++j) {
				AB[j*np+i] = AB[t+j] / h;
			}
			for(j = l;j < N;++j) {
				s = 0.0;
				for(k = l; k < N;++k) {
					s += AB[t+k] * AB[k*np+j];
				}
				for(k = l; k < N;++k) {
					AB[k*np+j] += (s * AB[k*np+i]);
				}
			}
		}
		for(j = l; j < N;++j) {
			AB[t+j] = AB[j*np+i] = 0.0;
		}

		AB[t+i] = 1.0;
		g = e[i];
		l = i;
	}

	eps = eps *x;
	n1 = N + 1;

	for(i = M; i < N;++i) {
		for(j = n1 - 1; j < np;++j)  {
			AB[i * np +j] = 0.0;
		}
	}

	for(k = N - 1; k >= 0; --k) {
		iter = 0;

		while(1) {
			iter++;
			if (iter > SVDMAXITER) {
				printf("Convergence Not Achieved \n");
				return 15;
			}

			cancel = 1;
			for(l = k; l >= 0; --l) {
				if (fabs(e[l]) <= eps) {
					cancel = 0; //test f convergence
					break;
				}
				if (fabs(q[l-1]) <= eps) {
					//Cancel
					break;
				}
			}
			if (cancel) {
				c = 0.0;
				s = 1.0;
				l1 = l - 1;
				for(i = l; i <= k;++i) {
					f = s*e[i];
					e[i] *= c;
					if (fabs(f) <= eps) {
						break;
					}
					g = q[i];
					h = q[i] = hypot(f,g);
					c = g/h;
					s = -f/h;
					for(j = n1-1; j < np;++j) {
						y = AB[l1 * np + j];
						z = AB[i * np + j];

						AB[l1 * np + j] = y * c + z * s;
						AB[i * np + j] = z * c - y * s;
					}
				}
			}
			z = q[k];
			if (l != k) {
				x = q[l];
				y = q[k-1];
				g = e[k-1];
				h = e[k];
				f = 0.5 * (((g + z) / h) * ((g - z) / y) + y / h - h / y);
				g = hypot(f,1.0);
				if (f < 0.0) {
					temp = f - g;
				} else {
					temp = f+g;
				}
				f = x - (z / x) * z + (h / x) * (y / temp - h);

				//Next QR Transformation

				c = s = 1.0;
				for(i = l+1; i <= k;++i) {
					g = e[i];
					y = q[i];
					h = s * g;
					g = c * g;
					e[i-1] = z = hypot(f,h);
                    c = f / z;
                    s = h / z;
                    f = x * c + g * s;
                    g = g * c - x * s;
                    h = y * s;
                    y *= c;
                    for(j = 0; j < N;++j) {
                    	t = j * np;
                        x = AB[t+i-1];
                        z = AB[t+i];
                        AB[t+i-1] = x * c + z * s;
                        AB[t+i] = z * c - x * s;
                    }
                    q[i-1] = z = hypot(f,h);
                    if (z != 0.0) {
                        c = f / z;
                        s = h / z;
                    }
                    f = c * g + s * y;
                    x = c * y - s * g;
                    for(j = n1-1; j < np;++j) {
                        y = AB[(i-1) * np + j];
                        z = AB[i * np + j];
                        AB[(i-1) * np + j] = y * c + z * s;
                        AB[i * np + j] = z * c - y * s;
                    }
				}
                    e[l] = 0.0;
                    e[k] = f;
                    q[k] = x;

			} else {
				//convergence
                if (z < 0.0) {
                    q[k] = -z;
                    for (j = 0; j < N; j++) {
                    	t = j * np;
                        AB[t+k] = -AB[t+k];
                    }
                }
                break;
			}
		}
	}

	free(e);
	return ierr;

}